

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O0

void object_sferror(void *x,char *header,char *filename,int errnum,t_soundfile *sf)

{
  char *pcVar1;
  char *pcVar2;
  t_soundfile *sf_local;
  int errnum_local;
  char *filename_local;
  char *header_local;
  void *x_local;
  
  if ((sf == (t_soundfile *)0x0) || (sf->sf_type == (_soundfile_type *)0x0)) {
    pcVar2 = soundfile_strerror(errnum);
    pd_error(x,"%s: %s: %s",header,filename,pcVar2);
  }
  else {
    pcVar2 = sf->sf_type->t_name;
    pcVar1 = soundfile_strerror(errnum);
    pd_error(x,"%s %s: %s: %s",header,pcVar2,filename,pcVar1);
  }
  return;
}

Assistant:

static void object_sferror(const void *x, const char *header,
    const char *filename, int errnum, const t_soundfile *sf)
{
    if (sf && sf->sf_type)
        pd_error(x, "%s %s: %s: %s", header, sf->sf_type->t_name, filename,
            soundfile_strerror(errnum));
    else
        pd_error(x, "%s: %s: %s", header, filename, soundfile_strerror(errnum));
}